

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O3

void update_pcrange(attr *attr,attr_val *val,pcrange *pcrange)

{
  undefined8 *in_RCX;
  int iVar1;
  int iVar2;
  
  iVar2 = (int)attr;
  iVar1 = (int)val;
  if (iVar2 == 0x55) {
    if (iVar1 == 3) {
LAB_0012e6de:
      in_RCX[5] = pcrange;
      *(undefined4 *)(in_RCX + 6) = 1;
      return;
    }
    if (iVar1 == 0xc) {
      in_RCX[5] = pcrange;
      in_RCX[6] = 0x100000001;
    }
    else if (iVar1 == 10) goto LAB_0012e6de;
  }
  else if (iVar2 == 0x12) {
    if (iVar1 == 3) {
      in_RCX[2] = pcrange;
      in_RCX[3] = 0x100000001;
      return;
    }
    if (iVar1 == 2) {
      in_RCX[2] = pcrange;
      *(undefined4 *)(in_RCX + 3) = 1;
      *(undefined4 *)(in_RCX + 4) = 1;
      return;
    }
    if (iVar1 == 1) {
      in_RCX[2] = pcrange;
      *(undefined4 *)(in_RCX + 3) = 1;
      return;
    }
  }
  else if (iVar2 == 0x11) {
    if (iVar1 == 2) {
      *in_RCX = pcrange;
      in_RCX[1] = 0x100000001;
      return;
    }
    if (iVar1 == 1) {
      *in_RCX = pcrange;
      *(undefined4 *)(in_RCX + 1) = 1;
      return;
    }
  }
  return;
}

Assistant:

static void
update_pcrange (const struct attr* attr, const struct attr_val* val,
		struct pcrange *pcrange)
{
  switch (attr->name)
    {
    case DW_AT_low_pc:
      if (val->encoding == ATTR_VAL_ADDRESS)
	{
	  pcrange->lowpc = (uintptr_t) val->u.uint;
	  pcrange->have_lowpc = 1;
	}
      else if (val->encoding == ATTR_VAL_ADDRESS_INDEX)
	{
	  pcrange->lowpc = (uintptr_t) val->u.uint;
	  pcrange->have_lowpc = 1;
	  pcrange->lowpc_is_addr_index = 1;
	}
      break;

    case DW_AT_high_pc:
      if (val->encoding == ATTR_VAL_ADDRESS)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	}
      else if (val->encoding == ATTR_VAL_UINT)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	  pcrange->highpc_is_relative = 1;
	}
      else if (val->encoding == ATTR_VAL_ADDRESS_INDEX)
	{
	  pcrange->highpc = (uintptr_t) val->u.uint;
	  pcrange->have_highpc = 1;
	  pcrange->highpc_is_addr_index = 1;
	}
      break;

    case DW_AT_ranges:
      if (val->encoding == ATTR_VAL_UINT
	  || val->encoding == ATTR_VAL_REF_SECTION)
	{
	  pcrange->ranges = val->u.uint;
	  pcrange->have_ranges = 1;
	}
      else if (val->encoding == ATTR_VAL_RNGLISTS_INDEX)
	{
	  pcrange->ranges = val->u.uint;
	  pcrange->have_ranges = 1;
	  pcrange->ranges_is_index = 1;
	}
      break;

    default:
      break;
    }
}